

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

int snprintf_canframe(char *buf,size_t size,cu_t *cu,int sep)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int in_ECX;
  uint *in_RDX;
  int iVar5;
  long in_RSI;
  char *in_RDI;
  uchar dlc;
  int len;
  int offset;
  int i;
  uchar is_canfd;
  uint local_5c;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  cVar1 = *(char *)((long)in_RDX + 5);
  local_4 = (int)in_RSI;
  if (in_RSI != 0) {
    if ((in_RDX[1] & 0x80) == 0) {
      if (cVar1 == '\0') {
        if ((byte)in_RDX[1] < 9) {
          local_4c = (uint)(byte)in_RDX[1];
        }
        else {
          local_4c = 8;
        }
        local_34 = local_4c;
      }
      else {
        if ((byte)in_RDX[1] < 0x41) {
          local_48 = (uint)(byte)in_RDX[1];
        }
        else {
          local_48 = 0x40;
        }
        local_34 = local_48;
      }
      if (in_ECX == 0) {
        local_5c = 0;
      }
      else {
        local_5c = local_34;
      }
      iVar4 = 0;
      if ((*in_RDX & 0x40000000) != 0) {
        iVar4 = 2;
      }
      if (in_RSI - 1U <
          (ulong)((long)(int)(local_34 << 1) + 0xc + (long)(int)local_5c + (long)iVar4)) {
        memset(in_RDI,0x2d,in_RSI - 1);
        in_RDI[in_RSI + -1] = '\0';
      }
      else {
        if ((*in_RDX & 0x20000000) == 0) {
          if ((*in_RDX & 0x80000000) == 0) {
            _put_id(in_RDI,2,*in_RDX & 0x7ff);
            in_RDI[3] = '#';
            local_30 = 4;
          }
          else {
            _put_id(in_RDI,7,*in_RDX & 0x1fffffff);
            in_RDI[8] = '#';
            local_30 = 9;
          }
        }
        else {
          _put_id(in_RDI,7,*in_RDX & 0x3fffffff);
          in_RDI[8] = '#';
          local_30 = 9;
        }
        if ((cVar1 == '\0') && ((*in_RDX & 0x40000000) != 0)) {
          iVar4 = local_30 + 1;
          in_RDI[local_30] = 'R';
          if ((local_34 != 0) && (local_34 < 9)) {
            iVar5 = local_30 + 2;
            in_RDI[iVar4] = "0123456789ABCDEF"[(int)((byte)in_RDX[1] & 0xf)];
            iVar4 = iVar5;
            if ((local_34 == 8) &&
               ((8 < *(byte *)((long)in_RDX + 7) && (*(byte *)((long)in_RDX + 7) < 0x10)))) {
              in_RDI[iVar5] = '_';
              in_RDI[local_30 + 3] = "0123456789ABCDEF"[(int)(*(byte *)((long)in_RDX + 7) & 0xf)];
              iVar4 = local_30 + 4;
            }
          }
          local_30 = iVar4;
          in_RDI[local_30] = '\0';
          local_4 = local_30;
        }
        else {
          iVar4 = local_30;
          if (cVar1 != '\0') {
            in_RDI[local_30] = '#';
            iVar4 = local_30 + 2;
            in_RDI[local_30 + 1] = "0123456789ABCDEF"[(int)(*(byte *)((long)in_RDX + 5) & 0xf)];
            if ((in_ECX != 0) && (local_34 != 0)) {
              in_RDI[iVar4] = '.';
              iVar4 = local_30 + 3;
            }
          }
          local_30 = iVar4;
          for (local_2c = 0; local_2c < (int)local_34; local_2c = local_2c + 1) {
            put_hex_byte(in_RDI + local_30,*(__u8 *)((long)in_RDX + (long)local_2c + 8));
            iVar4 = local_30 + 2;
            if ((in_ECX != 0) && (local_2c + 1 < (int)local_34)) {
              in_RDI[iVar4] = '.';
              iVar4 = local_30 + 3;
            }
            local_30 = iVar4;
          }
          if ((((cVar1 == '\0') && (local_34 == 8)) &&
              (bVar2 = *(byte *)((long)in_RDX + 7), 8 < bVar2)) && (bVar2 < 0x10)) {
            iVar4 = local_30 + 1;
            in_RDI[local_30] = '_';
            local_30 = local_30 + 2;
            in_RDI[iVar4] = "0123456789ABCDEF"[(int)(bVar2 & 0xf)];
          }
          in_RDI[local_30] = '\0';
          local_4 = local_30;
        }
      }
    }
    else {
      uVar3 = (uint)*(ushort *)((long)in_RDX + 6);
      local_44 = uVar3;
      if (in_ECX == 0) {
        local_44 = 0;
      }
      if (in_RSI - 1U < (ulong)((long)(int)(uVar3 << 1) + 0x16 + (long)(int)local_44)) {
        memset(in_RDI,0x2d,in_RSI - 1);
        in_RDI[in_RSI + -1] = '\0';
      }
      else {
        local_30 = sprintf(in_RDI,"%02X%03X#%02X:%02X:%08X#",(ulong)((*in_RDX & 0xff0000) >> 0x10),
                           (ulong)(*in_RDX & 0x7ff),(ulong)(byte)in_RDX[1],
                           (ulong)*(byte *)((long)in_RDX + 5),in_RDX[2]);
        for (local_2c = 0; local_2c < (int)uVar3; local_2c = local_2c + 1) {
          put_hex_byte(in_RDI + local_30,*(__u8 *)((long)in_RDX + (long)local_2c + 0xc));
          iVar4 = local_30 + 2;
          if ((in_ECX != 0) && (local_2c + 1 < (int)uVar3)) {
            in_RDI[iVar4] = '.';
            iVar4 = local_30 + 3;
          }
          local_30 = iVar4;
        }
        in_RDI[local_30] = '\0';
        local_4 = local_30;
      }
    }
  }
  return local_4;
}

Assistant:

int snprintf_canframe(char *buf, size_t size, cu_t *cu, int sep)
{
	/* documentation see lib.h */

	unsigned char is_canfd = cu->fd.flags;
	int i, offset;
	int len;

	/* ensure space for string termination */
	if (size < 1)
		return size;

	/* handle CAN XL frames */
	if (cu->xl.flags & CANXL_XLF) {
		len = cu->xl.len;

		/* check if the CAN frame fits into the provided buffer */
		if (sizeof("00123#11:22:12345678#") + 2 * len + (sep ? len : 0) > size - 1) {
			/* mark buffer overflow in output */
			memset(buf, '-', size - 1);
			buf[size - 1] = 0;
			return size;
		}

		/* print prio and CAN XL header content */
		offset = sprintf(buf, "%02X%03X#%02X:%02X:%08X#",
				 (canid_t)(cu->xl.prio & CANXL_VCID_MASK) >> CANXL_VCID_OFFSET,
				 (canid_t)(cu->xl.prio & CANXL_PRIO_MASK),
				 cu->xl.flags, cu->xl.sdt, cu->xl.af);

		/* data */
		for (i = 0; i < len; i++) {
			put_hex_byte(buf + offset, cu->xl.data[i]);
			offset += 2;
			if (sep && (i + 1 < len))
				buf[offset++] = '.';
		}

		buf[offset] = 0;

		return offset;
	}

	/* handle CAN CC/FD frames - ensure max length values */
	if (is_canfd)
		len = (cu->fd.len > CANFD_MAX_DLEN) ? CANFD_MAX_DLEN : cu->fd.len;
	else
		len = (cu->fd.len > CAN_MAX_DLEN) ? CAN_MAX_DLEN : cu->fd.len;

	/* check if the CAN frame fits into the provided buffer */
	if (sizeof("12345678#_F") + 2 * len + (sep ? len : 0) +	\
	    (cu->fd.can_id & CAN_RTR_FLAG ? 2 : 0) > size - 1) {
		/* mark buffer overflow in output */
		memset(buf, '-', size - 1);
		buf[size - 1] = 0;
		return size;
	}

	if (cu->fd.can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cu->fd.can_id & (CAN_ERR_MASK | CAN_ERR_FLAG));
		buf[8] = '#';
		offset = 9;
	} else if (cu->fd.can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cu->fd.can_id & CAN_EFF_MASK);
		buf[8] = '#';
		offset = 9;
	} else {
		put_sff_id(buf, cu->fd.can_id & CAN_SFF_MASK);
		buf[3] = '#';
		offset = 4;
	}

	/* CAN CC frames may have RTR enabled. There are no ERR frames with RTR */
	if (!is_canfd && cu->fd.can_id & CAN_RTR_FLAG) {
		buf[offset++] = 'R';
		/* print a given CAN 2.0B DLC if it's not zero */
		if (len && len <= CAN_MAX_DLEN) {
			buf[offset++] = hex_asc_upper_lo(cu->fd.len);

			/* check for optional raw DLC value for CAN 2.0B frames */
			if (len == CAN_MAX_DLEN) {
				if ((cu->cc.len8_dlc > CAN_MAX_DLEN) && (cu->cc.len8_dlc <= CAN_MAX_RAW_DLC)) {
					buf[offset++] = CC_DLC_DELIM;
					buf[offset++] = hex_asc_upper_lo(cu->cc.len8_dlc);
				}
			}
		}

		buf[offset] = 0;
		return offset;
	}

	/* any CAN FD flags */
	if (is_canfd) {
		/* add CAN FD specific escape char and flags */
		buf[offset++] = '#';
		buf[offset++] = hex_asc_upper_lo(cu->fd.flags);
		if (sep && len)
			buf[offset++] = '.';
	}

	/* data */
	for (i = 0; i < len; i++) {
		put_hex_byte(buf + offset, cu->fd.data[i]);
		offset += 2;
		if (sep && (i + 1 < len))
			buf[offset++] = '.';
	}

	/* check for extra DLC when having a Classic CAN with 8 bytes payload */
	if (!is_canfd && (len == CAN_MAX_DLEN)) {
		unsigned char dlc = cu->cc.len8_dlc;

		if ((dlc > CAN_MAX_DLEN) && (dlc <= CAN_MAX_RAW_DLC)) {
			buf[offset++] = CC_DLC_DELIM;
			buf[offset++] = hex_asc_upper_lo(dlc);
		}
	}

	buf[offset] = 0;

	return offset;
}